

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O1

void sysbvm_function_recordBindingWithOwnerAndName
               (sysbvm_context_t *context,sysbvm_tuple_t function,sysbvm_tuple_t owner,
               sysbvm_tuple_t name)

{
  ulong uVar1;
  uint uVar2;
  
  if ((function & 0xf) == 0 && function != 0) {
    uVar1 = *(ulong *)function;
    if (((uVar1 & 0xf) == 0 && uVar1 != 0) && ((*(byte *)(uVar1 + 8) & 0x80) == 0)) {
      uVar1 = *(ulong *)(uVar1 + 0x70);
      if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
        uVar2 = (uint)((long)uVar1 >> 4);
      }
      else {
        uVar2 = (uint)*(undefined8 *)(uVar1 + 0x10);
      }
    }
    else {
      uVar2 = 0;
    }
    if ((uVar2 >> 0xc & 1) != 0) {
      sysbvm_programEntity_recordBindingWithOwnerAndName(context,function,owner,name);
      if (*(sysbvm_tuple_t *)(function + 0x48) != 0) {
        sysbvm_programEntity_recordBindingWithOwnerAndName
                  (context,*(sysbvm_tuple_t *)(function + 0x48),owner,name);
        return;
      }
    }
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_function_recordBindingWithOwnerAndName(sysbvm_context_t *context, sysbvm_tuple_t function, sysbvm_tuple_t owner, sysbvm_tuple_t name)
{
    (void)context;
    if(!sysbvm_tuple_isFunction(context, function)) return;

    sysbvm_function_t *functionObject = (sysbvm_function_t*)function;
    sysbvm_programEntity_recordBindingWithOwnerAndName(context, function, owner, name);

    // Record the owner also in the definition.
    if(functionObject->definition)
        sysbvm_programEntity_recordBindingWithOwnerAndName(context, functionObject->definition, owner, name);
}